

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_log.cpp
# Opt level: O1

void duckdb::ThrowIfNotConstant(Expression *arg)

{
  pointer pcVar1;
  int iVar2;
  BinderException *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  iVar2 = (*(arg->super_BaseExpression)._vptr_BaseExpression[0xf])();
  if ((char)iVar2 != '\0') {
    return;
  }
  this = (BinderException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"write_log: argument \'%s\' must be constant","");
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  pcVar1 = (arg->super_BaseExpression).alias._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + (arg->super_BaseExpression).alias._M_string_length)
  ;
  BinderException::BinderException<std::__cxx11::string>(this,&local_48,&local_68);
  __cxa_throw(this,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void ThrowIfNotConstant(const Expression &arg) {
	if (!arg.IsFoldable()) {
		throw BinderException("write_log: argument '%s' must be constant", arg.alias);
	}
}